

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall google::protobuf::internal::ExtensionSet::IsInitialized(ExtensionSet *this)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  LogMessage *other;
  _Base_ptr p_Var5;
  long lVar6;
  _Rb_tree_header *p_Var7;
  long lVar8;
  bool bVar9;
  LogFinisher local_69;
  LogMessage local_68;
  
  p_Var5 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  bVar9 = (_Rb_tree_header *)p_Var5 == p_Var7;
  if (!bVar9) {
    do {
      bVar1 = *(byte *)&p_Var5[1]._M_left;
      if ((byte)(bVar1 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x35);
        other = LogMessage::operator<<
                          (&local_68,
                           "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_69,other);
        LogMessage::~LogMessage(&local_68);
      }
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
        if (*(char *)((long)&p_Var5[1]._M_left + 1) == '\x01') {
          iVar2 = *(int *)&(p_Var5[1]._M_parent)->_M_parent;
          bVar3 = 0 < iVar2;
          if (0 < iVar2) {
            cVar4 = (**(code **)(*(long *)**(undefined8 **)p_Var5[1]._M_parent + 0x28))();
            if (cVar4 != '\0') {
              lVar8 = 1;
              do {
                lVar6 = (long)*(int *)&(p_Var5[1]._M_parent)->_M_parent;
                bVar3 = lVar8 < lVar6;
                if (lVar6 <= lVar8) goto LAB_0016855f;
                cVar4 = (**(code **)(**(long **)(*(long *)p_Var5[1]._M_parent + lVar8 * 8) + 0x28))
                                  ();
                lVar8 = lVar8 + 1;
              } while (cVar4 != '\0');
            }
            if (bVar3) {
              return bVar9;
            }
          }
        }
        else if (((ulong)p_Var5[1]._M_left & 0x10000) == 0) {
          if (((ulong)p_Var5[1]._M_left & 0x100000) == 0) {
            cVar4 = (**(code **)(*(long *)p_Var5[1]._M_parent + 0x28))();
          }
          else {
            cVar4 = (**(code **)(*(long *)p_Var5[1]._M_parent + 0x38))();
          }
          if (cVar4 == '\0') {
            return bVar9;
          }
        }
      }
LAB_0016855f:
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      bVar9 = (_Rb_tree_header *)p_Var5 == p_Var7;
    } while (!bVar9);
  }
  return bVar9;
}

Assistant:

bool ExtensionSet::IsInitialized() const {
  // Extensions are never required.  However, we need to check that all
  // embedded messages are initialized.
  for (map<int, Extension>::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    const Extension& extension = iter->second;
    if (cpp_type(extension.type) == WireFormatLite::CPPTYPE_MESSAGE) {
      if (extension.is_repeated) {
        for (int i = 0; i < extension.repeated_message_value->size(); i++) {
          if (!extension.repeated_message_value->Get(i).IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!extension.is_cleared) {
          if (extension.is_lazy) {
            if (!extension.lazymessage_value->IsInitialized()) return false;
          } else {
            if (!extension.message_value->IsInitialized()) return false;
          }
        }
      }
    }
  }

  return true;
}